

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O1

size_t __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::expires_after(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *this,implementation_type *impl,duration_type *expiry_time,error_code *ec)

{
  ulong uVar1;
  size_t sVar2;
  error_category *peVar3;
  long lVar4;
  
  lVar4 = 0x7fffffffffffffff;
  uVar1 = std::chrono::_V2::steady_clock::now();
  if ((long)uVar1 < 0) {
    if (SBORROW8(expiry_time->__r,-(uVar1 & 0x7fffffffffffffff)) !=
        (long)(expiry_time->__r + (uVar1 & 0x7fffffffffffffff)) < 0) {
      lVar4 = -0x8000000000000000;
      goto LAB_00192732;
    }
  }
  else if ((long)(0x7fffffffffffffff - uVar1) < expiry_time->__r) goto LAB_00192732;
  lVar4 = uVar1 + expiry_time->__r;
LAB_00192732:
  sVar2 = cancel(this,impl,ec);
  (impl->expiry).__d.__r = lVar4;
  peVar3 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar3;
  return sVar2;
}

Assistant:

std::size_t expires_after(implementation_type& impl,
      const duration_type& expiry_time, asio::error_code& ec)
  {
    return expires_at(impl,
        Time_Traits::add(Time_Traits::now(), expiry_time), ec);
  }